

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O3

bool iutest::detail::IFileSystem::ReadAll(char *filename,string *dst)

{
  char cVar1;
  long *plVar2;
  long *local_40 [2];
  long local_30 [2];
  
  if ((GetInstanceVariable()::v != (long *)0x0) &&
     (plVar2 = (long *)(**(code **)(*GetInstanceVariable()::v + 0x18))(), plVar2 != (long *)0x0)) {
    cVar1 = (**(code **)(*plVar2 + 0x28))(plVar2,filename,1);
    if (cVar1 != '\0') {
      (**(code **)(plVar2[1] + 0x20))((string *)local_40,plVar2 + 1);
      std::__cxx11::string::operator=((string *)dst,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
      if (GetInstanceVariable()::v == (long *)0x0) {
        return true;
      }
      (**(code **)(*GetInstanceVariable()::v + 0x20))(GetInstanceVariable()::v,plVar2);
      return true;
    }
    if (GetInstanceVariable()::v != (long *)0x0) {
      (**(code **)(*GetInstanceVariable()::v + 0x20))(GetInstanceVariable()::v,plVar2);
    }
  }
  return false;
}

Assistant:

static bool ReadAll(const char* filename, ::std::string& dst)
    {
        IFile* fp = detail::IFileSystem::New();
        if(fp == NULL)
        {
            return false;
        }

        if(!fp->Open(filename, IFile::OpenRead))
        {
            detail::IFileSystem::Free(fp);
            return false;
        }

        dst = fp->ReadAll();
        detail::IFileSystem::Free(fp);
        return true;
    }